

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool Json::convertToDouble(char *str,double *_ret)

{
  bool bVar1;
  int *piVar2;
  double dVar3;
  char *endptr;
  char *local_28;
  
  local_28 = (char *)0x0;
  piVar2 = __errno_location();
  *piVar2 = 0;
  dVar3 = strtod(str,&local_28);
  if (*piVar2 == 0x22 && ABS(dVar3) == INFINITY) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if (((*piVar2 == 0 || dVar3 != 0.0) && (local_28 != str)) &&
       (bVar1 = true, _ret != (double *)0x0)) {
      *_ret = dVar3;
    }
  }
  return bVar1;
}

Assistant:

static bool
convertToDouble (const char *str, double *_ret)
{
  char *endptr = NULL;
  double val;

  errno = 0; /* To distinguish success/failure after call */
  val = strtod(str, &endptr);

  if ((errno == ERANGE && (val == HUGE_VAL || val == -HUGE_VAL))
      || (errno != 0 && val == 0)) {
    return false;
  }

  if (str == endptr) {
    /* Nothing parsed from the string */
    return false;
  }

  if (_ret != NULL) {
    *_ret = val;
  }

  return true;
}